

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::Read
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,TPZStream *buf,void *context)

{
  long lVar1;
  
  TPZGeoPyramid::Read(&this->super_TPZGeoPyramid,buf,context);
  lVar1 = 0x38;
  do {
    (**(code **)(*(long *)((long)(this->super_TPZGeoPyramid).
                                 super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
                          lVar1 + -8) + 0x30))
              ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.
                     fNodeIndexes + lVar1 + -8,buf,context);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1a0);
  lVar1 = 0x1a0;
  do {
    (**(code **)(*(long *)((long)(this->super_TPZGeoPyramid).
                                 super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
                          lVar1 + -8) + 0x30))
              ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.
                     fNodeIndexes + lVar1 + -8,buf,context);
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x1a00);
  return;
}

Assistant:

void Read(TPZStream &buf, void *context) override{
            TGeo::Read(buf, context);
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is].Read(buf, context);
            }
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fTrans[is].Read(buf, context);
            }
        }